

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * google::protobuf::anon_unknown_1::ToJsonName(string *input)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  ulong in_RSI;
  string *in_RDI;
  int i;
  bool capitalize_next;
  string *result;
  undefined4 local_28;
  
  bVar1 = false;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)in_RDI);
  for (local_28 = 0; uVar2 = std::__cxx11::string::size(), (ulong)(long)local_28 < uVar2;
      local_28 = local_28 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
    if (*pcVar3 == '_') {
      bVar1 = true;
    }
    else if (bVar1) {
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
      ToUpper(*pcVar3);
      std::__cxx11::string::push_back((char)in_RDI);
      bVar1 = false;
    }
    else {
      std::__cxx11::string::operator[](in_RSI);
      std::__cxx11::string::push_back((char)in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

std::string ToJsonName(const std::string& input) {
  bool capitalize_next = false;
  std::string result;
  result.reserve(input.size());

  for (int i = 0; i < input.size(); i++) {
    if (input[i] == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(ToUpper(input[i]));
      capitalize_next = false;
    } else {
      result.push_back(input[i]);
    }
  }

  return result;
}